

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

void __thiscall
async_simple::coro::Lazy<cinatra::part_head_t>::~Lazy(Lazy<cinatra::part_head_t> *this)

{
  detail::LazyBase<cinatra::part_head_t,_false>::~LazyBase
            (&this->super_LazyBase<cinatra::part_head_t,_false>);
  return;
}

Assistant:

class [[nodiscard]] CORO_ONLY_DESTROY_WHEN_DONE ELIDEABLE_AFTER_AWAIT Lazy
    : public detail::LazyBase<T, /*reschedule=*/false> {
    using Base = detail::LazyBase<T, false>;

public:
    using Base::Base;

    // Bind an executor to a Lazy, and convert it to RescheduleLazy.
    // You can only call via on rvalue, i.e. a Lazy is not accessible after
    // via() called.
    RescheduleLazy<T> via(Executor* ex) && {
        logicAssert(this->_coro.operator bool(),
                    "Lazy do not have a coroutine_handle "
                    "Maybe the allocation failed or you're using a used Lazy");

        this->_coro.promise()._executor = ex;
        return RescheduleLazy<T>(std::exchange(this->_coro, nullptr));
    }

    // Bind an executor only. Don't re-schedule.
    //
    // Users shouldn't use `setEx` directly. `setEx` is designed
    // for internal purpose only. See uthread/Await.h/await for details.
    Lazy<T> setEx(Executor* ex) && {
        logicAssert(this->_coro.operator bool(),
                    "Lazy do not have a coroutine_handle "
                    "Maybe the allocation failed or you're using a used Lazy");
        this->_coro.promise()._executor = ex;
        return Lazy<T>(std::exchange(this->_coro, nullptr));
    }

    auto coAwait(Executor* ex) {
        logicAssert(this->_coro.operator bool(),
                    "Lazy do not have a coroutine_handle "
                    "Maybe the allocation failed or you're using a used Lazy");

        // derived lazy inherits executor
        this->_coro.promise()._executor = ex;
        return typename Base::ValueAwaiter(std::exchange(this->_coro, nullptr));
    }

private:
    friend class RescheduleLazy<T>;
}